

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueRelations.cpp
# Opt level: O2

bool __thiscall
dg::vr::ValueRelations::merge(ValueRelations *this,ValueRelations *other,Relations relations)

{
  Type TVar1;
  pointer pDVar2;
  bool bVar3;
  bool bVar4;
  HandlePtr rt;
  HandlePtr lt;
  bool bVar5;
  iterator __end2;
  iterator __begin2;
  EdgeIterator local_110;
  iterator local_a0;
  
  RelationsGraph<dg::vr::ValueRelations>::begin(&local_a0,&other->graph);
  local_110.visited._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_110.visited._M_t._M_impl.super__Rb_tree_header._M_header;
  local_110.visited._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_110.visited._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_110.bucketIt._M_node = &(other->graph).buckets._M_t._M_impl.super__Rb_tree_header._M_header;
  local_110.visited._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_110.edgeIt.allowedEdges.bits.super__Base_bitset<1UL>._M_w =
       (bitset<12UL>)(_Base_bitset<1UL>)0x0;
  local_110.edgeIt.undirectedOnly = false;
  local_110.edgeIt.relationsFocused = false;
  local_110.edgeIt.stack.
  super__Vector_base<dg::vr::Bucket::DirectRelIterator,_std::allocator<dg::vr::Bucket::DirectRelIterator>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_110.edgeIt.stack.
  super__Vector_base<dg::vr::Bucket::DirectRelIterator,_std::allocator<dg::vr::Bucket::DirectRelIterator>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_110.edgeIt.stack.
  super__Vector_base<dg::vr::Bucket::DirectRelIterator,_std::allocator<dg::vr::Bucket::DirectRelIterator>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_110.edgeIt.visited._M_data = &local_110.visited;
  bVar5 = true;
  local_110.visited._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_110.visited._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_110.endIt._M_node = local_110.bucketIt._M_node;
  while (bVar3 = operator!=(&local_a0,&local_110),
        pDVar2 = local_a0.edgeIt.stack.
                 super__Vector_base<dg::vr::Bucket::DirectRelIterator,_std::allocator<dg::vr::Bucket::DirectRelIterator>_>
                 ._M_impl.super__Vector_impl_data._M_finish, bVar3) {
    TVar1 = local_a0.edgeIt.stack.
            super__Vector_base<dg::vr::Bucket::DirectRelIterator,_std::allocator<dg::vr::Bucket::DirectRelIterator>_>
            ._M_impl.super__Vector_impl_data._M_finish[-1].current._rel;
    bVar3 = bVar5;
    if ((((ulong)relations.bits.super__Base_bitset<1UL>._M_w >> ((ulong)TVar1 & 0x3f) & 1) != 0) &&
       ((TVar1 != EQ ||
        (bVar4 = hasEqual<dg::vr::Bucket>
                           (other,local_a0.edgeIt.stack.
                                  super__Vector_base<dg::vr::Bucket::DirectRelIterator,_std::allocator<dg::vr::Bucket::DirectRelIterator>_>
                                  ._M_impl.super__Vector_impl_data._M_finish[-1].current._to._M_data
                           ), bVar4)))) {
      rt = getAndMerge(this,other,pDVar2[-1].current._to._M_data);
      lt = getCorresponding(this,other,pDVar2[-1].current._from._M_data);
      if (lt == (HandlePtr)0x0 || rt == (HandlePtr)0x0) {
        bVar3 = false;
      }
      else {
        bVar4 = RelationsGraph<dg::vr::ValueRelations>::haveConflictingRelation
                          (&this->graph,lt,pDVar2[-1].current._rel,rt,(Relations *)0x0);
        bVar3 = false;
        if (!bVar4) {
          bVar3 = RelationsGraph<dg::vr::ValueRelations>::addRelation
                            (&this->graph,lt,pDVar2[-1].current._rel,rt,(Relations *)0x0);
          this->changed = (bool)(this->changed | bVar3);
          bVar3 = bVar5;
        }
      }
    }
    bVar5 = bVar3;
    RelationsGraph<dg::vr::ValueRelations>::EdgeIterator::operator++(&local_a0);
  }
  RelationsGraph<dg::vr::ValueRelations>::EdgeIterator::~EdgeIterator(&local_110);
  RelationsGraph<dg::vr::ValueRelations>::EdgeIterator::~EdgeIterator(&local_a0);
  return bVar5;
}

Assistant:

bool ValueRelations::merge(const ValueRelations &other, Relations relations) {
    bool noConflict = true;
    for (const auto &edge : other.graph) {
        if (!relations.has(edge.rel()) ||
            (edge.rel() == Relations::EQ && !other.hasEqual(edge.to())))
            continue;

        HandlePtr thisToH = getAndMerge(other, edge.to());
        HandlePtr thisFromH = getCorresponding(other, edge.from());

        if (!thisToH || !thisFromH ||
            graph.haveConflictingRelation(*thisFromH, edge.rel(), *thisToH)) {
            noConflict = false;
            continue;
        }

        bool ch = graph.addRelation(*thisFromH, edge.rel(), *thisToH);
        updateChanged(ch);
    }
    return noConflict;
}